

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void zng_tr_flush_block(deflate_state *s,char *buf,uint32_t stored_len,int last)

{
  ushort uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ct_data *tree;
  ulong uVar8;
  ct_data *tree_00;
  uint uVar9;
  uint uVar10;
  uint64_t val;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar28;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar13;
  
  if (s->sym_next == 0) {
    s->static_len = 7;
    uVar5 = 0;
    uVar8 = 0;
    uVar10 = 0;
  }
  else if (s->level < 1) {
    uVar5 = (ulong)(stored_len + 5);
    uVar10 = 0;
    uVar8 = uVar5;
  }
  else {
    if (s->strm->data_type == 2) {
      uVar5 = 0xf3ffc07f;
      lVar7 = 0;
      do {
        if (((uVar5 & 1) != 0) && (s->dyn_ltree[lVar7].fc.freq != 0)) {
          iVar21 = 0;
          goto LAB_001020b4;
        }
        lVar7 = lVar7 + 1;
        uVar5 = uVar5 >> 1;
      } while (lVar7 != 0x20);
      if (((s->dyn_ltree[9].fc.freq == 0) && (s->dyn_ltree[10].fc.freq == 0)) &&
         (s->dyn_ltree[0xd].fc.freq == 0)) {
        lVar7 = 0;
        iVar21 = 0;
        do {
          if (s->dyn_ltree[lVar7 + 0x20].fc.freq != 0) goto LAB_0010209c;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0xe0);
      }
      else {
LAB_0010209c:
        iVar21 = 1;
      }
LAB_001020b4:
      s->strm->data_type = iVar21;
    }
    build_tree(s,&s->l_desc);
    build_tree(s,&s->d_desc);
    scan_tree(s,s->dyn_ltree,(s->l_desc).max_code);
    scan_tree(s,s->dyn_dtree,(s->d_desc).max_code);
    build_tree(s,&s->bl_desc);
    uVar5 = 0x12;
    do {
      uVar10 = (uint)uVar5;
      if (s->bl_tree["\x10\x11\x12"[uVar5]].dl.dad != 0) goto LAB_00102140;
      uVar5 = (ulong)(uVar10 - 1);
    } while (3 < uVar10);
    uVar10 = 2;
LAB_00102140:
    uVar2 = s->opt_len;
    s->opt_len = uVar2 + (long)(int)uVar10 * 3 + 0x11;
    uVar5 = uVar2 + (long)(int)uVar10 * 3 + 0x1b >> 3;
    uVar8 = s->static_len + 10 >> 3;
    if ((uVar8 <= uVar5) || (s->strategy == 4)) {
      uVar5 = uVar8;
    }
  }
  if ((buf == (char *)0x0) || (uVar5 < stored_len + 4)) {
    uVar9 = s->bi_valid;
    uVar6 = uVar9 + 3;
    uVar11 = s->bi_buf;
    bVar4 = (byte)uVar9;
    if (uVar8 == uVar5) {
      uVar5 = (ulong)(last + 2U);
      if ((uVar6 | uVar9) < 0x40) {
        uVar5 = uVar5 << (bVar4 & 0x3f) | uVar11;
      }
      else if (uVar9 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar5 << (bVar4 & 0x3f) | uVar11;
        s->pending = s->pending + 8;
        uVar5 = (ulong)(last + 2U >> (-bVar4 & 0x3f));
        uVar6 = uVar9 - 0x3d;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar11;
        s->pending = s->pending + 8;
        uVar6 = 3;
      }
      s->bi_valid = uVar6;
      s->bi_buf = uVar5;
      tree_00 = static_ltree;
      tree = static_dtree;
    }
    else {
      uVar5 = (ulong)(last + 4U);
      if ((uVar6 | uVar9) < 0x40) {
        uVar5 = uVar5 << (bVar4 & 0x3f) | uVar11;
      }
      else if (uVar9 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar5 << (bVar4 & 0x3f) | uVar11;
        s->pending = s->pending + 8;
        uVar5 = (ulong)(last + 4U >> (-bVar4 & 0x3f));
        uVar6 = uVar9 - 0x3d;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar11;
        s->pending = s->pending + 8;
        uVar6 = 3;
      }
      s->bi_valid = uVar6;
      s->bi_buf = uVar5;
      iVar21 = (s->l_desc).max_code;
      iVar28 = (s->d_desc).max_code;
      uVar11 = (ulong)iVar28;
      uVar8 = (long)iVar21 - 0x100;
      uVar9 = uVar6 + 5;
      bVar4 = (byte)uVar6;
      if ((uVar9 | uVar6) < 0x40) {
        uVar8 = uVar8 << (bVar4 & 0x3f) | uVar5;
      }
      else if (uVar6 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar8 << (bVar4 & 0x3f) | uVar5;
        s->pending = s->pending + 8;
        uVar8 = uVar8 >> (-bVar4 & 0x3f);
        uVar9 = uVar6 - 0x3b;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar5;
        s->pending = s->pending + 8;
        uVar9 = 5;
      }
      uVar6 = uVar9 + 5;
      bVar4 = (byte)uVar9;
      if ((uVar6 | uVar9) < 0x40) {
        uVar11 = uVar11 << (bVar4 & 0x3f) | uVar8;
      }
      else if (uVar9 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar11 << (bVar4 & 0x3f) | uVar8;
        s->pending = s->pending + 8;
        uVar11 = uVar11 >> (-bVar4 & 0x3f);
        uVar6 = uVar9 - 0x3b;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar8;
        s->pending = s->pending + 8;
        uVar6 = 5;
      }
      uVar5 = (long)(int)uVar10 - 3;
      uVar9 = uVar6 + 4;
      bVar4 = (byte)uVar6;
      if ((uVar9 | uVar6) < 0x40) {
        uVar5 = uVar5 << (bVar4 & 0x3f) | uVar11;
      }
      else if (uVar6 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar5 << (bVar4 & 0x3f) | uVar11;
        s->pending = s->pending + 8;
        uVar5 = uVar5 >> (-bVar4 & 0x3f);
        uVar9 = uVar6 - 0x3c;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar11;
        s->pending = s->pending + 8;
        uVar9 = 4;
      }
      if (-1 < (int)uVar10) {
        uVar8 = 0;
        do {
          uVar1 = s->bl_tree["\x10\x11\x12"[uVar8]].dl.dad;
          uVar11 = (ulong)uVar1;
          bVar4 = (byte)uVar9;
          if ((uVar9 + 3 | uVar9) < 0x40) {
            uVar5 = uVar11 << (bVar4 & 0x3f) | uVar5;
            uVar9 = uVar9 + 3;
          }
          else if (uVar9 < 0x40) {
            *(ulong *)(s->pending_buf + s->pending) = uVar11 << (bVar4 & 0x3f) | uVar5;
            s->pending = s->pending + 8;
            uVar9 = uVar9 - 0x3d;
            uVar5 = (ulong)(uVar1 >> (-bVar4 & 0x3f));
          }
          else {
            *(ulong *)(s->pending_buf + s->pending) = uVar5;
            s->pending = s->pending + 8;
            uVar9 = 3;
            uVar5 = uVar11;
          }
          uVar8 = uVar8 + 1;
        } while (uVar10 + 1 != uVar8);
      }
      s->bi_buf = uVar5;
      s->bi_valid = uVar9;
      tree_00 = s->dyn_ltree;
      send_tree(s,tree_00,iVar21);
      tree = s->dyn_dtree;
      send_tree(s,tree,iVar28);
    }
    compress_block(s,tree_00,tree);
  }
  else {
    zng_tr_stored_block(s,buf,stored_len,last);
  }
  auVar3 = _DAT_00104370;
  lVar7 = 0x48;
  auVar33 = _DAT_00104320;
  auVar15 = _DAT_00104330;
  auVar17 = _DAT_00104340;
  auVar19 = _DAT_00104350;
  do {
    auVar22 = auVar19 ^ auVar3;
    iVar21 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar29._4_4_ = iVar21;
    auVar29._0_4_ = iVar21;
    auVar29._8_4_ = iVar28;
    auVar29._12_4_ = iVar28;
    auVar38._0_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar38._4_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar38._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar38._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar23._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar38;
    auVar22 = pshuflw(auVar29,auVar23,0xe8);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -0x1c) = 0;
    }
    auVar22 = packssdw(auVar23,auVar23);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -0x18) = 0;
    }
    auVar22 = auVar17 ^ auVar3;
    iVar21 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar30._4_4_ = iVar21;
    auVar30._0_4_ = iVar21;
    auVar30._8_4_ = iVar28;
    auVar30._12_4_ = iVar28;
    auVar39._0_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar39._4_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar39._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar39._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar24._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar39;
    auVar22 = packssdw(auVar30,auVar24);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -0x14) = 0;
    }
    auVar22 = pshufhw(auVar24,auVar24,0x84);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -0x10) = 0;
    }
    auVar22 = auVar15 ^ auVar3;
    iVar21 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar31._4_4_ = iVar21;
    auVar31._0_4_ = iVar21;
    auVar31._8_4_ = iVar28;
    auVar31._12_4_ = iVar28;
    auVar40._0_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar40._4_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar40._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar40._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar25._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar40;
    auVar22 = pshuflw(auVar31,auVar25,0xe8);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -0xc) = 0;
    }
    auVar22 = packssdw(auVar25,auVar25);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -8) = 0;
    }
    auVar22 = auVar33 ^ auVar3;
    iVar21 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar32._4_4_ = iVar21;
    auVar32._0_4_ = iVar21;
    auVar32._8_4_ = iVar28;
    auVar32._12_4_ = iVar28;
    auVar41._0_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar41._4_4_ = -(uint)(iVar21 < -0x7ffffee2);
    auVar41._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar41._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar26._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar41;
    auVar22 = packssdw(auVar32,auVar26);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar7 * 4 + -4) = 0;
    }
    auVar22 = pshufhw(auVar26,auVar26,0x84);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)&s->strm + lVar7 * 4) = 0;
    }
    lVar13 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 8;
    auVar19._8_8_ = lVar13 + 8;
    lVar13 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 8;
    auVar17._8_8_ = lVar13 + 8;
    lVar13 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 8;
    auVar15._8_8_ = lVar13 + 8;
    lVar13 = auVar33._8_8_;
    auVar33._0_8_ = auVar33._0_8_ + 8;
    auVar33._8_8_ = lVar13 + 8;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x168);
  lVar7 = 0;
  auVar22 = _DAT_00104320;
  auVar16 = _DAT_00104330;
  auVar18 = _DAT_00104340;
  auVar20 = _DAT_00104350;
  do {
    auVar33 = auVar20 ^ auVar3;
    auVar42._0_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar42._4_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar42._8_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar42._12_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar34._0_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar34._4_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar34._8_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar34._12_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar34 = auVar34 & auVar42;
    auVar33 = pshuflw(auVar42,auVar34,0xe8);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7].fc.freq = 0;
    }
    auVar33 = packssdw(auVar34,auVar34);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
      s->dyn_dtree[lVar7 + 1].fc.freq = 0;
    }
    auVar33 = auVar18 ^ auVar3;
    iVar21 = auVar33._0_4_;
    iVar28 = auVar33._8_4_;
    auVar43._4_4_ = iVar21;
    auVar43._0_4_ = iVar21;
    auVar43._8_4_ = iVar28;
    auVar43._12_4_ = iVar28;
    auVar45._0_4_ = -(uint)(iVar21 < -0x7fffffe2);
    auVar45._4_4_ = -(uint)(iVar21 < -0x7fffffe2);
    auVar45._8_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar45._12_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar35._0_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar35._4_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar35._8_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar35._12_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar35 = auVar35 & auVar45;
    auVar33 = packssdw(auVar43,auVar35);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7 + 2].fc.freq = 0;
    }
    auVar33 = pshufhw(auVar35,auVar35,0x84);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7 + 3].fc.freq = 0;
    }
    auVar33 = auVar16 ^ auVar3;
    iVar21 = auVar33._0_4_;
    iVar28 = auVar33._8_4_;
    auVar44._4_4_ = iVar21;
    auVar44._0_4_ = iVar21;
    auVar44._8_4_ = iVar28;
    auVar44._12_4_ = iVar28;
    auVar46._0_4_ = -(uint)(iVar21 < -0x7fffffe2);
    auVar46._4_4_ = -(uint)(iVar21 < -0x7fffffe2);
    auVar46._8_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar46._12_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar36._0_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar36._4_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar36._8_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar36._12_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar36 = auVar36 & auVar46;
    auVar33 = pshuflw(auVar44,auVar36,0xe8);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7 + 4].fc.freq = 0;
    }
    auVar33 = packssdw(auVar36,auVar36);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7 + 5].fc.freq = 0;
    }
    auVar33 = auVar22 ^ auVar3;
    auVar37._4_4_ = auVar33._4_4_;
    auVar37._12_4_ = auVar33._12_4_;
    auVar47._0_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar47._4_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar47._8_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar47._12_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar37._0_4_ = auVar37._4_4_;
    auVar37._8_4_ = auVar37._12_4_;
    auVar27._0_4_ = -(uint)(auVar37._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar37._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar37._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar37._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar47;
    auVar33 = packssdw(auVar37,auVar27);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7 + 6].fc.freq = 0;
    }
    auVar33 = pshufhw(auVar27,auVar27,0x84);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar7 + 7].fc.freq = 0;
    }
    lVar7 = lVar7 + 8;
    lVar13 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 8;
    auVar20._8_8_ = lVar13 + 8;
    lVar13 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 8;
    auVar18._8_8_ = lVar13 + 8;
    lVar13 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 8;
    auVar16._8_8_ = lVar13 + 8;
    lVar13 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 8;
    auVar22._8_8_ = lVar13 + 8;
  } while (lVar7 != 0x20);
  lVar7 = 0;
  auVar12 = _DAT_00104340;
  auVar14 = _DAT_00104350;
  do {
    if (SUB164(auVar14 ^ auVar3,4) == -0x80000000 && SUB164(auVar14 ^ auVar3,0) < -0x7fffffed) {
      s->bl_tree[lVar7].fc.freq = 0;
      s->bl_tree[lVar7 + 1].fc.freq = 0;
    }
    if (SUB164(auVar12 ^ auVar3,4) == -0x80000000 && SUB164(auVar12 ^ auVar3,0) < -0x7fffffed) {
      s->bl_tree[lVar7 + 2].fc.freq = 0;
      s->bl_tree[lVar7 + 3].fc.freq = 0;
    }
    lVar7 = lVar7 + 4;
    lVar13 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 4;
    auVar14._8_8_ = lVar13 + 4;
    lVar13 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 4;
    auVar12._8_8_ = lVar13 + 4;
  } while (lVar7 != 0x14);
  s->dyn_ltree[0x100].fc.freq = 1;
  s->sym_next = 0;
  s->opt_len = 0;
  s->static_len = 0;
  s->matches = 0;
  if (last != 0) {
    if (s->bi_valid < 0x39) {
      if (0x18 < s->bi_valid) {
        *(int *)(s->pending_buf + s->pending) = (int)s->bi_buf;
        s->pending = s->pending + 4;
        s->bi_buf = (ulong)*(uint *)((long)&s->bi_buf + 4);
        s->bi_valid = s->bi_valid + -0x20;
      }
      if (8 < s->bi_valid) {
        *(short *)(s->pending_buf + s->pending) = (short)s->bi_buf;
        s->pending = s->pending + 2;
        s->bi_buf = s->bi_buf >> 0x10;
        s->bi_valid = s->bi_valid + -0x10;
      }
      if (0 < s->bi_valid) {
        uVar10 = s->pending;
        s->pending = uVar10 + 1;
        s->pending_buf[uVar10] = (uchar)s->bi_buf;
      }
    }
    else {
      *(uint64_t *)(s->pending_buf + s->pending) = s->bi_buf;
      s->pending = s->pending + 8;
    }
    s->bi_buf = 0;
    s->bi_valid = 0;
  }
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_block(deflate_state *s, char *buf, uint32_t stored_len, int last) {
    /* buf: input block, or NULL if too old */
    /* stored_len: length of input block */
    /* last: one if this is the last block for a file */
    unsigned long opt_lenb, static_lenb; /* opt_len and static_len in bytes */
    int max_blindex = 0;  /* index of last bit length code of non zero freq */

    /* Build the Huffman trees unless a stored block is forced */
    if (UNLIKELY(s->sym_next == 0)) {
        /* Emit an empty static tree block with no codes */
        opt_lenb = static_lenb = 0;
        s->static_len = 7;
    } else if (s->level > 0) {
        /* Check if the file is binary or text */
        if (s->strm->data_type == Z_UNKNOWN)
            s->strm->data_type = detect_data_type(s);

        /* Construct the literal and distance trees */
        build_tree(s, (tree_desc *)(&(s->l_desc)));
        Tracev((stderr, "\nlit data: dyn %lu, stat %lu", s->opt_len, s->static_len));

        build_tree(s, (tree_desc *)(&(s->d_desc)));
        Tracev((stderr, "\ndist data: dyn %lu, stat %lu", s->opt_len, s->static_len));
        /* At this point, opt_len and static_len are the total bit lengths of
         * the compressed block data, excluding the tree representations.
         */

        /* Build the bit length tree for the above two trees, and get the index
         * in bl_order of the last bit length code to send.
         */
        max_blindex = build_bl_tree(s);

        /* Determine the best encoding. Compute the block lengths in bytes. */
        opt_lenb = (s->opt_len+3+7) >> 3;
        static_lenb = (s->static_len+3+7) >> 3;

        Tracev((stderr, "\nopt %lu(%lu) stat %lu(%lu) stored %u lit %u ",
                opt_lenb, s->opt_len, static_lenb, s->static_len, stored_len,
                s->sym_next / 3));

        if (static_lenb <= opt_lenb || s->strategy == Z_FIXED)
            opt_lenb = static_lenb;

    } else {
        Assert(buf != NULL, "lost buf");
        opt_lenb = static_lenb = stored_len + 5; /* force a stored block */
    }

    if (stored_len+4 <= opt_lenb && buf != NULL) {
        /* 4: two words for the lengths
         * The test buf != NULL is only necessary if LIT_BUFSIZE > WSIZE.
         * Otherwise we can't have processed more than WSIZE input bytes since
         * the last block flush, because compression would have been
         * successful. If LIT_BUFSIZE <= WSIZE, it is never too late to
         * transform a block into a stored block.
         */
        zng_tr_stored_block(s, buf, stored_len, last);

    } else if (static_lenb == opt_lenb) {
        zng_tr_emit_tree(s, STATIC_TREES, last);
        compress_block(s, (const ct_data *)static_ltree, (const ct_data *)static_dtree);
        cmpr_bits_add(s, s->static_len);
    } else {
        zng_tr_emit_tree(s, DYN_TREES, last);
        send_all_trees(s, s->l_desc.max_code+1, s->d_desc.max_code+1, max_blindex+1);
        compress_block(s, (const ct_data *)s->dyn_ltree, (const ct_data *)s->dyn_dtree);
        cmpr_bits_add(s, s->opt_len);
    }
    Assert(s->compressed_len == s->bits_sent, "bad compressed size");
    /* The above check is made mod 2^32, for files larger than 512 MB
     * and unsigned long implemented on 32 bits.
     */
    init_block(s);

    if (last) {
        zng_tr_emit_align(s);
    }
    Tracev((stderr, "\ncomprlen %lu(%lu) ", s->compressed_len>>3, s->compressed_len-7*last));
}